

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST_Parser.cpp
# Opt level: O1

void __thiscall nigel::AST_Parser::fillSFR(AST_Parser *this,shared_ptr<nigel::AstBlock> *block)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  *plVar3;
  undefined1 local_b5;
  BasicType local_b4;
  AstVariable *local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined8 local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_78;
  int local_70 [2];
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  local_68;
  
  peVar2 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_70[1] = 0;
  local_70[0] = 0x80;
  local_b4 = tByte;
  local_b0 = (AstVariable *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nigel::AstVariable,std::allocator<nigel::AstVariable>,nigel::MemModel,char_const(&)[4],int,nigel::BasicType>
            (&_Stack_a8,&local_b0,(allocator<nigel::AstVariable> *)&local_b5,
             (MemModel *)(local_70 + 1),(char (*) [4])"@P0",local_70,&local_b4);
  std::__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<nigel::AstVariable,nigel::AstVariable>
            ((__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2> *)&local_b0,local_b0);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"@P0","");
  local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_a8._M_pi;
  local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b0;
  local_b0 = (AstVariable *)0x0;
  _Stack_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar3 = &peVar2->variables;
  paVar1 = &local_68.first.first.field_2;
  if (local_a0 == &local_90) {
    local_68.first.first.field_2._8_8_ = local_90._8_8_;
    local_68.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_68.first.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_68.first.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_68.first.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_68.first.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.second = 0;
  local_a0 = &local_90;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
  ::
  _M_insert<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>
            ((list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
              *)plVar3,(iterator)plVar3,&local_68);
  if (local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.first.second.
               super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.first.first._M_dataplus._M_p,
                    local_68.first.first.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  if (_Stack_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a8._M_pi);
  }
  peVar2 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_70[1] = 0;
  local_70[0] = 0x90;
  local_b4 = tByte;
  local_b0 = (AstVariable *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nigel::AstVariable,std::allocator<nigel::AstVariable>,nigel::MemModel,char_const(&)[4],int,nigel::BasicType>
            (&_Stack_a8,&local_b0,(allocator<nigel::AstVariable> *)&local_b5,
             (MemModel *)(local_70 + 1),(char (*) [4])"@P1",local_70,&local_b4);
  std::__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<nigel::AstVariable,nigel::AstVariable>
            ((__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2> *)&local_b0,local_b0);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"@P1","");
  local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_a8._M_pi;
  local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b0;
  local_b0 = (AstVariable *)0x0;
  _Stack_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar3 = &peVar2->variables;
  if (local_a0 == &local_90) {
    local_68.first.first.field_2._8_8_ = local_90._8_8_;
    local_68.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_68.first.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_68.first.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_68.first.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_68.first.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.second = 0;
  local_a0 = &local_90;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
  ::
  _M_insert<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>
            ((list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
              *)plVar3,(iterator)plVar3,&local_68);
  if (local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.first.second.
               super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.first.first._M_dataplus._M_p,
                    local_68.first.first.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  if (_Stack_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a8._M_pi);
  }
  peVar2 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_70[1] = 0;
  local_70[0] = 0xa0;
  local_b4 = tByte;
  local_b0 = (AstVariable *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nigel::AstVariable,std::allocator<nigel::AstVariable>,nigel::MemModel,char_const(&)[4],int,nigel::BasicType>
            (&_Stack_a8,&local_b0,(allocator<nigel::AstVariable> *)&local_b5,
             (MemModel *)(local_70 + 1),(char (*) [4])"@P2",local_70,&local_b4);
  std::__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<nigel::AstVariable,nigel::AstVariable>
            ((__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2> *)&local_b0,local_b0);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"@P2","");
  local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_a8._M_pi;
  local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b0;
  local_b0 = (AstVariable *)0x0;
  _Stack_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar3 = &peVar2->variables;
  if (local_a0 == &local_90) {
    local_68.first.first.field_2._8_8_ = local_90._8_8_;
    local_68.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_68.first.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_68.first.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_68.first.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_68.first.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.second = 0;
  local_a0 = &local_90;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
  ::
  _M_insert<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>
            ((list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
              *)plVar3,(iterator)plVar3,&local_68);
  if (local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.first.second.
               super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.first.first._M_dataplus._M_p,
                    local_68.first.first.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  if (_Stack_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a8._M_pi);
  }
  peVar2 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_70[1] = 0;
  local_70[0] = 0xb0;
  local_b4 = tByte;
  local_b0 = (AstVariable *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nigel::AstVariable,std::allocator<nigel::AstVariable>,nigel::MemModel,char_const(&)[4],int,nigel::BasicType>
            (&_Stack_a8,&local_b0,(allocator<nigel::AstVariable> *)&local_b5,
             (MemModel *)(local_70 + 1),(char (*) [4])"@P3",local_70,&local_b4);
  std::__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<nigel::AstVariable,nigel::AstVariable>
            ((__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2> *)&local_b0,local_b0);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"@P3","");
  local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_a8._M_pi;
  local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b0;
  local_b0 = (AstVariable *)0x0;
  _Stack_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar3 = &peVar2->variables;
  if (local_a0 == &local_90) {
    local_68.first.first.field_2._8_8_ = local_90._8_8_;
    local_68.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_68.first.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_68.first.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_68.first.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_68.first.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.second = 0;
  local_a0 = &local_90;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
  ::
  _M_insert<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>
            ((list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
              *)plVar3,(iterator)plVar3,&local_68);
  if (local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.first.second.
               super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.first.first._M_dataplus._M_p,
                    local_68.first.first.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  if (_Stack_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a8._M_pi);
  }
  peVar2 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_70[1] = 0;
  local_70[0] = 0x8a;
  local_b4 = tByte;
  local_b0 = (AstVariable *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nigel::AstVariable,std::allocator<nigel::AstVariable>,nigel::MemModel,char_const(&)[5],int,nigel::BasicType>
            (&_Stack_a8,&local_b0,(allocator<nigel::AstVariable> *)&local_b5,
             (MemModel *)(local_70 + 1),(char (*) [5])"@TL0",local_70,&local_b4);
  std::__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<nigel::AstVariable,nigel::AstVariable>
            ((__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2> *)&local_b0,local_b0);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"@TL0","");
  local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_a8._M_pi;
  local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b0;
  local_b0 = (AstVariable *)0x0;
  _Stack_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar3 = &peVar2->variables;
  if (local_a0 == &local_90) {
    local_68.first.first.field_2._8_8_ = local_90._8_8_;
    local_68.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_68.first.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_68.first.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_68.first.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_68.first.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.second = 0;
  local_a0 = &local_90;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
  ::
  _M_insert<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>
            ((list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
              *)plVar3,(iterator)plVar3,&local_68);
  if (local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.first.second.
               super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.first.first._M_dataplus._M_p,
                    local_68.first.first.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  if (_Stack_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a8._M_pi);
  }
  peVar2 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_70[1] = 0;
  local_70[0] = 0x8b;
  local_b4 = tByte;
  local_b0 = (AstVariable *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nigel::AstVariable,std::allocator<nigel::AstVariable>,nigel::MemModel,char_const(&)[5],int,nigel::BasicType>
            (&_Stack_a8,&local_b0,(allocator<nigel::AstVariable> *)&local_b5,
             (MemModel *)(local_70 + 1),(char (*) [5])"@TH0",local_70,&local_b4);
  std::__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<nigel::AstVariable,nigel::AstVariable>
            ((__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2> *)&local_b0,local_b0);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"@TH0","");
  local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_a8._M_pi;
  local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b0;
  local_b0 = (AstVariable *)0x0;
  _Stack_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar3 = &peVar2->variables;
  if (local_a0 == &local_90) {
    local_68.first.first.field_2._8_8_ = local_90._8_8_;
    local_68.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_68.first.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_68.first.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_68.first.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_68.first.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.second = 0;
  local_a0 = &local_90;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
  ::
  _M_insert<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>
            ((list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
              *)plVar3,(iterator)plVar3,&local_68);
  if (local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.first.second.
               super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.first.first._M_dataplus._M_p,
                    local_68.first.first.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  if (_Stack_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a8._M_pi);
  }
  peVar2 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_70[1] = 0;
  local_70[0] = 0x8c;
  local_b4 = tByte;
  local_b0 = (AstVariable *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nigel::AstVariable,std::allocator<nigel::AstVariable>,nigel::MemModel,char_const(&)[5],int,nigel::BasicType>
            (&_Stack_a8,&local_b0,(allocator<nigel::AstVariable> *)&local_b5,
             (MemModel *)(local_70 + 1),(char (*) [5])"@TL1",local_70,&local_b4);
  std::__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<nigel::AstVariable,nigel::AstVariable>
            ((__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2> *)&local_b0,local_b0);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"@TL1","");
  local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_a8._M_pi;
  local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b0;
  local_b0 = (AstVariable *)0x0;
  _Stack_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar3 = &peVar2->variables;
  if (local_a0 == &local_90) {
    local_68.first.first.field_2._8_8_ = local_90._8_8_;
    local_68.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_68.first.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_68.first.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_68.first.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_68.first.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.second = 0;
  local_a0 = &local_90;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
  ::
  _M_insert<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>
            ((list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
              *)plVar3,(iterator)plVar3,&local_68);
  if (local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.first.second.
               super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.first.first._M_dataplus._M_p,
                    local_68.first.first.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  if (_Stack_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a8._M_pi);
  }
  peVar2 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_70[1] = 0;
  local_70[0] = 0x8d;
  local_b4 = tByte;
  local_b0 = (AstVariable *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nigel::AstVariable,std::allocator<nigel::AstVariable>,nigel::MemModel,char_const(&)[5],int,nigel::BasicType>
            (&_Stack_a8,&local_b0,(allocator<nigel::AstVariable> *)&local_b5,
             (MemModel *)(local_70 + 1),(char (*) [5])"@TH1",local_70,&local_b4);
  std::__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<nigel::AstVariable,nigel::AstVariable>
            ((__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2> *)&local_b0,local_b0);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"@TH1","");
  local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_a8._M_pi;
  local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b0;
  local_b0 = (AstVariable *)0x0;
  _Stack_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar3 = &peVar2->variables;
  if (local_a0 == &local_90) {
    local_68.first.first.field_2._8_8_ = local_90._8_8_;
    local_68.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_68.first.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_68.first.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_68.first.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_68.first.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.second = 0;
  local_a0 = &local_90;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
  ::
  _M_insert<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>
            ((list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
              *)plVar3,(iterator)plVar3,&local_68);
  if (local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.first.second.
               super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.first.first._M_dataplus._M_p,
                    local_68.first.first.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  if (_Stack_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a8._M_pi);
  }
  peVar2 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_70[1] = 0;
  local_70[0] = 0x89;
  local_b4 = tByte;
  local_b0 = (AstVariable *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nigel::AstVariable,std::allocator<nigel::AstVariable>,nigel::MemModel,char_const(&)[6],int,nigel::BasicType>
            (&_Stack_a8,&local_b0,(allocator<nigel::AstVariable> *)&local_b5,
             (MemModel *)(local_70 + 1),(char (*) [6])"@TMOD",local_70,&local_b4);
  std::__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<nigel::AstVariable,nigel::AstVariable>
            ((__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2> *)&local_b0,local_b0);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"@TMOD","");
  local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_a8._M_pi;
  local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b0;
  local_b0 = (AstVariable *)0x0;
  _Stack_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar3 = &peVar2->variables;
  if (local_a0 == &local_90) {
    local_68.first.first.field_2._8_8_ = local_90._8_8_;
    local_68.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_68.first.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_68.first.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_68.first.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_68.first.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.second = 0;
  local_a0 = &local_90;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
  ::
  _M_insert<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>
            ((list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
              *)plVar3,(iterator)plVar3,&local_68);
  if (local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.first.second.
               super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.first.first._M_dataplus._M_p,
                    local_68.first.first.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  if (_Stack_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a8._M_pi);
  }
  peVar2 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_70[1] = 0;
  local_70[0] = 0x88;
  local_b4 = tByte;
  local_b0 = (AstVariable *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nigel::AstVariable,std::allocator<nigel::AstVariable>,nigel::MemModel,char_const(&)[6],int,nigel::BasicType>
            (&_Stack_a8,&local_b0,(allocator<nigel::AstVariable> *)&local_b5,
             (MemModel *)(local_70 + 1),(char (*) [6])"@TCON",local_70,&local_b4);
  std::__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<nigel::AstVariable,nigel::AstVariable>
            ((__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2> *)&local_b0,local_b0);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"@TCON","");
  local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_a8._M_pi;
  local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b0;
  local_b0 = (AstVariable *)0x0;
  _Stack_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar3 = &peVar2->variables;
  if (local_a0 == &local_90) {
    local_68.first.first.field_2._8_8_ = local_90._8_8_;
    local_68.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_68.first.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_68.first.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_68.first.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_68.first.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.second = 0;
  local_a0 = &local_90;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
  ::
  _M_insert<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>
            ((list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
              *)plVar3,(iterator)plVar3,&local_68);
  if (local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.first.second.
               super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.first.first._M_dataplus._M_p,
                    local_68.first.first.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  if (_Stack_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a8._M_pi);
  }
  peVar2 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_70[1] = 0;
  local_70[0] = 0xb8;
  local_b4 = tByte;
  local_b0 = (AstVariable *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nigel::AstVariable,std::allocator<nigel::AstVariable>,nigel::MemModel,char_const(&)[4],int,nigel::BasicType>
            (&_Stack_a8,&local_b0,(allocator<nigel::AstVariable> *)&local_b5,
             (MemModel *)(local_70 + 1),(char (*) [4])"@IP",local_70,&local_b4);
  std::__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<nigel::AstVariable,nigel::AstVariable>
            ((__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2> *)&local_b0,local_b0);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"@IP","");
  local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_a8._M_pi;
  local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b0;
  local_b0 = (AstVariable *)0x0;
  _Stack_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar3 = &peVar2->variables;
  if (local_a0 == &local_90) {
    local_68.first.first.field_2._8_8_ = local_90._8_8_;
    local_68.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_68.first.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_68.first.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_68.first.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_68.first.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.second = 0;
  local_a0 = &local_90;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
  ::
  _M_insert<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>
            ((list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
              *)plVar3,(iterator)plVar3,&local_68);
  if (local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.first.second.
               super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.first.first._M_dataplus._M_p,
                    local_68.first.first.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  if (_Stack_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a8._M_pi);
  }
  peVar2 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_70[1] = 0;
  local_70[0] = 0xa8;
  local_b4 = tByte;
  local_b0 = (AstVariable *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nigel::AstVariable,std::allocator<nigel::AstVariable>,nigel::MemModel,char_const(&)[4],int,nigel::BasicType>
            (&_Stack_a8,&local_b0,(allocator<nigel::AstVariable> *)&local_b5,
             (MemModel *)(local_70 + 1),(char (*) [4])"@IE",local_70,&local_b4);
  std::__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<nigel::AstVariable,nigel::AstVariable>
            ((__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2> *)&local_b0,local_b0);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"@IE","");
  local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_a8._M_pi;
  local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b0;
  local_b0 = (AstVariable *)0x0;
  _Stack_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar3 = &peVar2->variables;
  if (local_a0 == &local_90) {
    local_68.first.first.field_2._8_8_ = local_90._8_8_;
    local_68.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_68.first.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_68.first.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_68.first.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_68.first.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.second = 0;
  local_a0 = &local_90;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
  ::
  _M_insert<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>
            ((list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
              *)plVar3,(iterator)plVar3,&local_68);
  if (local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.first.second.
               super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.first.first._M_dataplus._M_p,
                    local_68.first.first.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  if (_Stack_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a8._M_pi);
  }
  peVar2 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_70[1] = 0;
  local_70[0] = 0x87;
  local_b4 = tByte;
  local_b0 = (AstVariable *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nigel::AstVariable,std::allocator<nigel::AstVariable>,nigel::MemModel,char_const(&)[6],int,nigel::BasicType>
            (&_Stack_a8,&local_b0,(allocator<nigel::AstVariable> *)&local_b5,
             (MemModel *)(local_70 + 1),(char (*) [6])"@PCON",local_70,&local_b4);
  std::__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<nigel::AstVariable,nigel::AstVariable>
            ((__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2> *)&local_b0,local_b0);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"@PCON","");
  local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_a8._M_pi;
  local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b0;
  local_b0 = (AstVariable *)0x0;
  _Stack_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar3 = &peVar2->variables;
  if (local_a0 == &local_90) {
    local_68.first.first.field_2._8_8_ = local_90._8_8_;
    local_68.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_68.first.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_68.first.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_68.first.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_68.first.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.second = 0;
  local_a0 = &local_90;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
  ::
  _M_insert<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>
            ((list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
              *)plVar3,(iterator)plVar3,&local_68);
  if (local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.first.second.
               super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.first.first._M_dataplus._M_p,
                    local_68.first.first.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  if (_Stack_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a8._M_pi);
  }
  peVar2 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_70[1] = 0;
  local_70[0] = 0x98;
  local_b4 = tByte;
  local_b0 = (AstVariable *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nigel::AstVariable,std::allocator<nigel::AstVariable>,nigel::MemModel,char_const(&)[6],int,nigel::BasicType>
            (&_Stack_a8,&local_b0,(allocator<nigel::AstVariable> *)&local_b5,
             (MemModel *)(local_70 + 1),(char (*) [6])"@SCON",local_70,&local_b4);
  std::__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<nigel::AstVariable,nigel::AstVariable>
            ((__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2> *)&local_b0,local_b0);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"@SCON","");
  local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_a8._M_pi;
  local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b0;
  local_b0 = (AstVariable *)0x0;
  _Stack_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar3 = &peVar2->variables;
  if (local_a0 == &local_90) {
    local_68.first.first.field_2._8_8_ = local_90._8_8_;
    local_68.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_68.first.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_68.first.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_68.first.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_68.first.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.second = 0;
  local_a0 = &local_90;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
  ::
  _M_insert<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>
            ((list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
              *)plVar3,(iterator)plVar3,&local_68);
  if (local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.first.second.
               super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.first.first._M_dataplus._M_p,
                    local_68.first.first.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  if (_Stack_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a8._M_pi);
  }
  peVar2 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_70[1] = 0;
  local_70[0] = 0x99;
  local_b4 = tByte;
  local_b0 = (AstVariable *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nigel::AstVariable,std::allocator<nigel::AstVariable>,nigel::MemModel,char_const(&)[6],int,nigel::BasicType>
            (&_Stack_a8,&local_b0,(allocator<nigel::AstVariable> *)&local_b5,
             (MemModel *)(local_70 + 1),(char (*) [6])"@SBUF",local_70,&local_b4);
  std::__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<nigel::AstVariable,nigel::AstVariable>
            ((__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2> *)&local_b0,local_b0);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"@SBUF","");
  local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_a8._M_pi;
  local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b0;
  local_b0 = (AstVariable *)0x0;
  _Stack_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar3 = &peVar2->variables;
  if (local_a0 == &local_90) {
    local_68.first.first.field_2._8_8_ = local_90._8_8_;
    local_68.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_68.first.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_68.first.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_68.first.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_68.first.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.second = 0;
  local_a0 = &local_90;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
  ::
  _M_insert<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>
            ((list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
              *)plVar3,(iterator)plVar3,&local_68);
  if (local_68.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.first.second.
               super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.first.first._M_dataplus._M_p,
                    local_68.first.first.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  if (_Stack_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a8._M_pi);
  }
  return;
}

Assistant:

void AST_Parser::fillSFR( std::shared_ptr<AstBlock> block )
	{
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@P0", std::make_shared<AstVariable>( MemModel::fast, "@P0", 0x80, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@P1", std::make_shared<AstVariable>( MemModel::fast, "@P1", 0x90, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@P2", std::make_shared<AstVariable>( MemModel::fast, "@P2", 0xA0, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@P3", std::make_shared<AstVariable>( MemModel::fast, "@P3", 0xB0, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@TL0", std::make_shared<AstVariable>( MemModel::fast, "@TL0", 0x8A, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@TH0", std::make_shared<AstVariable>( MemModel::fast, "@TH0", 0x8B, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@TL1", std::make_shared<AstVariable>( MemModel::fast, "@TL1", 0x8C, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@TH1", std::make_shared<AstVariable>( MemModel::fast, "@TH1", 0x8D, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@TMOD", std::make_shared<AstVariable>( MemModel::fast, "@TMOD", 0x89, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@TCON", std::make_shared<AstVariable>( MemModel::fast, "@TCON", 0x88, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@IP", std::make_shared<AstVariable>( MemModel::fast, "@IP", 0xB8, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@IE", std::make_shared<AstVariable>( MemModel::fast, "@IE", 0xA8, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@PCON", std::make_shared<AstVariable>( MemModel::fast, "@PCON", 0x87, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@SCON", std::make_shared<AstVariable>( MemModel::fast, "@SCON", 0x98, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@SBUF", std::make_shared<AstVariable>( MemModel::fast, "@SBUF", 0x99, BasicType::tByte ) ), 0 ) );
	}